

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O3

int fiobj_iseq____internal_complex__(FIOBJ o,FIOBJ o2)

{
  long lVar1;
  uint uVar2;
  uintptr_t uVar3;
  void *ptr;
  size_t sVar4;
  int *piVar5;
  fiobj_object_vtable_s *pfVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  fiobj_stack_s left;
  fiobj_stack_s right;
  ulong local_80;
  long local_78;
  long lStack_70;
  undefined8 local_68;
  void *pvStack_60;
  long local_58;
  long lStack_50;
  undefined8 local_48;
  void *pvStack_40;
  
  local_68 = 0;
  pvStack_60 = (void *)0x0;
  local_78 = 0;
  lStack_70 = 0;
  local_48 = 0;
  pvStack_40 = (void *)0x0;
  local_58 = 0;
  lStack_50 = 0;
  local_80 = 0;
  ptr = (void *)0x0;
  uVar10 = 0;
  do {
    uVar2 = (uint)o & 6;
    if (((uVar2 != 6) && (o != 0)) && ((o & 1) == 0)) {
      if ((o & 6) == 0) {
        pfVar6 = &FIOBJECT_VTABLE_NUMBER;
        switch(*(undefined1 *)(o & 0xfffffffffffffff8)) {
        case 0x27:
          pfVar6 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          goto switchD_00145f95_caseD_28;
        case 0x29:
          pfVar6 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          goto switchD_00145f95_caseD_2a;
        case 0x2b:
          pfVar6 = &FIOBJECT_VTABLE_DATA;
        }
      }
      else if (uVar2 == 2) {
switchD_00145f95_caseD_28:
        pfVar6 = &FIOBJECT_VTABLE_STRING;
      }
      else {
switchD_00145f95_caseD_2a:
        pfVar6 = &FIOBJECT_VTABLE_HASH;
      }
      if (pfVar6->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
        if ((o & 6) == 0) {
          pfVar6 = &FIOBJECT_VTABLE_NUMBER;
          switch(*(undefined1 *)(o & 0xfffffffffffffff8)) {
          case 0x27:
            pfVar6 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case 0x28:
            goto switchD_00145fe8_caseD_28;
          case 0x29:
            pfVar6 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case 0x2a:
            goto switchD_00145fe8_caseD_2a;
          case 0x2b:
            pfVar6 = &FIOBJECT_VTABLE_DATA;
          }
        }
        else if (uVar2 == 2) {
switchD_00145fe8_caseD_28:
          pfVar6 = &FIOBJECT_VTABLE_STRING;
        }
        else {
switchD_00145fe8_caseD_2a:
          pfVar6 = &FIOBJECT_VTABLE_HASH;
        }
        (*pfVar6->each)(o,0,fiobj_iseq____internal_complex__task,&local_78);
      }
    }
    uVar2 = (uint)o2 & 6;
    if (((uVar2 != 6) && (o2 != 0)) && ((o2 & 1) == 0)) {
      if ((o2 & 6) == 0) {
        pfVar6 = &FIOBJECT_VTABLE_NUMBER;
        switch(*(undefined1 *)(o2 & 0xfffffffffffffff8)) {
        case 0x27:
          pfVar6 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          goto switchD_0014606d_caseD_28;
        case 0x29:
          pfVar6 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          goto switchD_0014606d_caseD_2a;
        case 0x2b:
          pfVar6 = &FIOBJECT_VTABLE_DATA;
        }
      }
      else if (uVar2 == 2) {
switchD_0014606d_caseD_28:
        pfVar6 = &FIOBJECT_VTABLE_STRING;
      }
      else {
switchD_0014606d_caseD_2a:
        pfVar6 = &FIOBJECT_VTABLE_HASH;
      }
      if (pfVar6->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
        if ((o2 & 6) == 0) {
          pfVar6 = &FIOBJECT_VTABLE_NUMBER;
          switch(*(undefined1 *)(o2 & 0xfffffffffffffff8)) {
          case 0x27:
            pfVar6 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case 0x28:
            goto switchD_001460c0_caseD_28;
          case 0x29:
            pfVar6 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case 0x2a:
            goto switchD_001460c0_caseD_2a;
          case 0x2b:
            pfVar6 = &FIOBJECT_VTABLE_DATA;
          }
        }
        else if (uVar2 == 2) {
switchD_001460c0_caseD_28:
          pfVar6 = &FIOBJECT_VTABLE_STRING;
        }
        else {
switchD_001460c0_caseD_2a:
          pfVar6 = &FIOBJECT_VTABLE_HASH;
        }
        (*pfVar6->each)(o2,0,fiobj_iseq____internal_complex__task,&local_58);
      }
    }
    if (lStack_70 != local_78) {
      do {
        lVar1 = lStack_70 + -1;
        uVar11 = *(ulong *)((long)pvStack_60 + lStack_70 * 8 + -8);
        if (lStack_50 == local_58) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(ulong *)((long)pvStack_40 + lStack_50 * 8 + -8);
          lStack_50 = lStack_50 + -1;
        }
        uVar2 = (uint)uVar11;
        lStack_70 = lVar1;
        if (uVar11 != uVar9) {
          iVar8 = 0;
          iVar7 = 0;
          if (((uVar11 == 0) || (uVar9 == 0)) || (iVar7 = iVar8, (~(uint)uVar9 & 6) == 0))
          goto LAB_00146529;
          if ((((uVar2 & 6) == 6) || ((((uint)uVar9 | uVar2) & 1) != 0)) ||
             (*(char *)(uVar11 & 0xfffffffffffffff8) != *(char *)(uVar9 & 0xfffffffffffffff8)))
          goto LAB_00146529;
          if ((uVar11 & 6) == 0) {
            pfVar6 = &FIOBJECT_VTABLE_NUMBER;
            switch(*(char *)(uVar11 & 0xfffffffffffffff8)) {
            case '\'':
              pfVar6 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_001461f3_caseD_28;
            case ')':
              pfVar6 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_001461f3_caseD_2a;
            case '+':
              pfVar6 = &FIOBJECT_VTABLE_DATA;
            }
          }
          else if ((uVar2 & 6) == 2) {
switchD_001461f3_caseD_28:
            pfVar6 = &FIOBJECT_VTABLE_STRING;
          }
          else {
switchD_001461f3_caseD_2a:
            pfVar6 = &FIOBJECT_VTABLE_HASH;
          }
          sVar4 = (*pfVar6->is_eq)(uVar11,uVar9);
          if (sVar4 == 0) goto LAB_00146529;
        }
        uVar2 = uVar2 & 6;
        if (((uVar2 != 6) && (uVar11 != 0)) && ((uVar11 & 1) == 0)) {
          if ((uVar11 & 6) == 0) {
            pfVar6 = &FIOBJECT_VTABLE_NUMBER;
            switch(*(undefined1 *)(uVar11 & 0xfffffffffffffff8)) {
            case 0x27:
              pfVar6 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case 0x28:
              goto switchD_00146271_caseD_28;
            case 0x29:
              pfVar6 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case 0x2a:
              goto switchD_00146271_caseD_2a;
            case 0x2b:
              pfVar6 = &FIOBJECT_VTABLE_DATA;
            }
          }
          else if (uVar2 == 2) {
switchD_00146271_caseD_28:
            pfVar6 = &FIOBJECT_VTABLE_STRING;
          }
          else {
switchD_00146271_caseD_2a:
            pfVar6 = &FIOBJECT_VTABLE_HASH;
          }
          if (pfVar6->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0
             ) {
            if ((uVar11 & 6) == 0) {
              pfVar6 = &FIOBJECT_VTABLE_NUMBER;
              switch(*(undefined1 *)(uVar11 & 0xfffffffffffffff8)) {
              case 0x27:
                pfVar6 = &FIOBJECT_VTABLE_FLOAT;
                break;
              case 0x28:
                goto switchD_001462c9_caseD_28;
              case 0x29:
                pfVar6 = &FIOBJECT_VTABLE_ARRAY;
                break;
              case 0x2a:
                goto switchD_001462c9_caseD_2a;
              case 0x2b:
                pfVar6 = &FIOBJECT_VTABLE_DATA;
              }
            }
            else if (uVar2 == 2) {
switchD_001462c9_caseD_28:
              pfVar6 = &FIOBJECT_VTABLE_STRING;
            }
            else {
switchD_001462c9_caseD_2a:
              pfVar6 = &FIOBJECT_VTABLE_HASH;
            }
            uVar3 = (*pfVar6->count)(uVar11);
            if (uVar3 != 0) {
              if ((local_80 <= uVar10) && (local_80 <= uVar10 + 5)) {
                ptr = fio_realloc2(ptr,(uVar10 + 4) * 8 + 0x10,uVar10 * 8);
                if (ptr == (void *)0x0) goto LAB_00146570;
                local_80 = uVar10 + 6;
              }
              *(ulong *)((long)ptr + uVar10 * 8) = uVar11;
              if ((local_80 <= uVar10 + 1) && (local_80 <= uVar10 + 6)) {
                ptr = fio_realloc2(ptr,(uVar10 + 6) * 8 + 0x10,(uVar10 + 1) * 8);
                if (ptr == (void *)0x0) {
LAB_00146570:
                  if (0 < FIO_LOG_LEVEL) {
                    FIO_LOG2STDERR(
                                  "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4920"
                                  );
                  }
                  kill(0,2);
                  piVar5 = __errno_location();
                  exit(*piVar5);
                }
                local_80 = uVar10 + 8;
              }
              *(ulong *)((long)ptr + uVar10 * 8 + 8) = uVar9;
              uVar10 = uVar10 + 2;
            }
          }
        }
      } while (lStack_70 != local_78);
    }
    iVar7 = 1;
    if (uVar10 == 0) goto LAB_00146529;
    if (uVar10 == 1) {
      o = 0;
      uVar11 = 0;
    }
    else {
      uVar11 = uVar10 - 2;
      o = *(ulong *)((long)ptr + uVar10 * 8 + -0x10);
    }
    o2 = *(ulong *)((long)ptr + uVar10 * 8 + -8);
    if (o != o2) {
      if (((o2 != 0) && (o != 0)) && ((~(uint)o2 & 6) != 0)) {
        uVar2 = (uint)o & 6;
        if (((uVar2 != 6) && ((((uint)o | (uint)o2) & 1) == 0)) &&
           (*(char *)(o & 0xfffffffffffffff8) == *(char *)(o2 & 0xfffffffffffffff8))) {
          if ((o & 6) == 0) {
            pfVar6 = &FIOBJECT_VTABLE_NUMBER;
            switch(*(char *)(o & 0xfffffffffffffff8)) {
            case '\'':
              pfVar6 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              goto switchD_0014647b_caseD_28;
            case ')':
              pfVar6 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              goto switchD_0014647b_caseD_2a;
            case '+':
              pfVar6 = &FIOBJECT_VTABLE_DATA;
            }
          }
          else if (uVar2 == 2) {
switchD_0014647b_caseD_28:
            pfVar6 = &FIOBJECT_VTABLE_STRING;
          }
          else {
switchD_0014647b_caseD_2a:
            pfVar6 = &FIOBJECT_VTABLE_HASH;
          }
          sVar4 = (*pfVar6->is_eq)(o,o2);
          if (sVar4 != 0) goto LAB_001464a4;
        }
      }
      iVar7 = 0;
      goto LAB_00146529;
    }
LAB_001464a4:
    uVar10 = uVar11;
    if (o == 0) {
LAB_00146529:
      fio_free(pvStack_60);
      local_68 = 0;
      pvStack_60 = (void *)0x0;
      local_78 = 0;
      lStack_70 = 0;
      fio_free(pvStack_40);
      local_48 = 0;
      pvStack_40 = (void *)0x0;
      local_58 = 0;
      lStack_50 = 0;
      fio_free(ptr);
      return iVar7;
    }
  } while( true );
}

Assistant:

int fiobj_iseq____internal_complex__(FIOBJ o, FIOBJ o2) {
  // if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
  //   return int fiobj_iseq____internal_complex__(const FIOBJ o, const FIOBJ
  //   o2);
  fiobj_stack_s left = FIO_ARY_INIT, right = FIO_ARY_INIT, queue = FIO_ARY_INIT;
  do {
    fiobj_each1(o, 0, fiobj_iseq____internal_complex__task, &left);
    fiobj_each1(o2, 0, fiobj_iseq____internal_complex__task, &right);
    while (fiobj_stack_count(&left)) {
      o = FIOBJ_INVALID;
      o2 = FIOBJ_INVALID;
      fiobj_stack_pop(&left, &o);
      fiobj_stack_pop(&right, &o2);
      if (!fiobj_iseq_simple(o, o2))
        goto unequal;
      if (FIOBJ_IS_ALLOCATED(o) && FIOBJECT2VTBL(o)->each &&
          FIOBJECT2VTBL(o)->count(o)) {
        fiobj_stack_push(&queue, o);
        fiobj_stack_push(&queue, o2);
      }
    }
    o = FIOBJ_INVALID;
    o2 = FIOBJ_INVALID;
    fiobj_stack_pop(&queue, &o2);
    fiobj_stack_pop(&queue, &o);
    if (!fiobj_iseq_simple(o, o2))
      goto unequal;
  } while (o);
  fiobj_stack_free(&left);
  fiobj_stack_free(&right);
  fiobj_stack_free(&queue);
  return 1;
unequal:
  fiobj_stack_free(&left);
  fiobj_stack_free(&right);
  fiobj_stack_free(&queue);
  return 0;
}